

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

SUNMatrix SUNBandMatrixStorage
                    (sunindextype N,sunindextype mu,sunindextype ml,sunindextype smu,
                    SUNContext sunctx)

{
  SUNMatrix_Ops p_Var1;
  int iVar2;
  SUNMatrix A;
  sunindextype *psVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  
  if (-1 < (smu | ml) && 0 < N) {
    A = SUNMatNewEmpty(sunctx);
    if (A != (SUNMatrix)0x0) {
      p_Var1 = A->ops;
      p_Var1->getid = SUNMatGetID_Band;
      p_Var1->clone = SUNMatClone_Band;
      p_Var1->destroy = SUNMatDestroy_Band;
      p_Var1->zero = SUNMatZero_Band;
      p_Var1->copy = SUNMatCopy_Band;
      p_Var1->scaleadd = SUNMatScaleAdd_Band;
      p_Var1->scaleaddi = SUNMatScaleAddI_Band;
      p_Var1->matvec = SUNMatMatvec_Band;
      p_Var1->space = SUNMatSpace_Band;
      psVar3 = (sunindextype *)malloc(0x30);
      if (psVar3 != (sunindextype *)0x0) {
        A->content = psVar3;
        iVar2 = ml + smu + 1;
        *psVar3 = N;
        psVar3[1] = N;
        psVar3[3] = mu;
        psVar3[4] = ml;
        psVar3[5] = smu;
        psVar3[2] = iVar2;
        psVar3[8] = iVar2 * N;
        psVar3[10] = 0;
        psVar3[0xb] = 0;
        pvVar4 = calloc((ulong)(uint)(iVar2 * N),8);
        *(void **)(psVar3 + 6) = pvVar4;
        if (pvVar4 != (void *)0x0) {
          pvVar4 = malloc((ulong)(uint)N * 8);
          *(void **)(psVar3 + 10) = pvVar4;
          if (pvVar4 != (void *)0x0) {
            lVar5 = 0;
            uVar6 = 0;
            do {
              *(long *)(*(long *)(psVar3 + 10) + uVar6 * 8) = *(long *)(psVar3 + 6) + lVar5;
              uVar6 = uVar6 + 1;
              lVar5 = lVar5 + (long)iVar2 * 8;
            } while ((uint)N != uVar6);
            return A;
          }
        }
      }
      SUNMatDestroy(A);
    }
  }
  return (SUNMatrix)0x0;
}

Assistant:

SUNMatrix SUNBandMatrixStorage(sunindextype N, sunindextype mu,
                               sunindextype ml, sunindextype smu,
                               SUNContext sunctx)
{
  SUNMatrix A;
  SUNMatrixContent_Band content;
  sunindextype j, colSize;

  /* return with NULL matrix on illegal dimension input */
  if ( (N <= 0) || (smu < 0) || (ml < 0) ) return(NULL);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  if (A == NULL) return(NULL);

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Band;
  A->ops->clone     = SUNMatClone_Band;
  A->ops->destroy   = SUNMatDestroy_Band;
  A->ops->zero      = SUNMatZero_Band;
  A->ops->copy      = SUNMatCopy_Band;
  A->ops->scaleadd  = SUNMatScaleAdd_Band;
  A->ops->scaleaddi = SUNMatScaleAddI_Band;
  A->ops->matvec    = SUNMatMatvec_Band;
  A->ops->space     = SUNMatSpace_Band;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Band) malloc(sizeof *content);
  if (content == NULL) { SUNMatDestroy(A); return(NULL); }

  /* Attach content */
  A->content = content;

  /* Fill content */
  colSize        = smu + ml + 1;
  content->M     = N;
  content->N     = N;
  content->mu    = mu;
  content->ml    = ml;
  content->s_mu  = smu;
  content->ldim  = colSize;
  content->ldata = N * colSize;
  content->data  = NULL;
  content->cols  = NULL;

  /* Allocate content */
  content->data = (realtype *) calloc(N * colSize, sizeof(realtype));
  if (content->data == NULL) { SUNMatDestroy(A); return(NULL); }

  content->cols = (realtype **) malloc(N * sizeof(realtype *));
  if (content->cols == NULL) { SUNMatDestroy(A); return(NULL); }
  for (j=0; j<N; j++) content->cols[j] = content->data + j * colSize;

  return(A);
}